

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrRepeat::generate(RandStrRepeat *this,wchar_t **dst)

{
  ulong uVar1;
  undefined8 in_RSI;
  ulong in_RDI;
  int i;
  ulong cnt;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  ulong local_18;
  
  if (*(int *)(in_RDI + 0x24) < 0) {
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x20); iVar2 = iVar2 + 1) {
      (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI);
    }
    iVar2 = 0;
    while( true ) {
      rng_next();
      uVar1 = rand_range(CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI,
                         CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffd7 = uVar1 < 0x43 && iVar2 < 0x32;
      if (uVar1 >= 0x43 || iVar2 >= 0x32) break;
      (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI);
      iVar2 = iVar2 + 1;
    }
  }
  else {
    rng_next();
    for (local_18 = rand_range(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI,
                               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
        local_18 != 0; local_18 = local_18 - 1) {
      (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI);
    }
  }
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        if (hi >= 0)
        {
            /* 
             *   Finite upper bound.  Pick a random repeat count from lo to
             *   hi, and generate our child that many times.  
             */
            for (ulong cnt = rand_range(rng_next(vmg0_), lo, hi) ;
                 cnt != 0 ; --cnt)
                firstChild->generate(vmg_ dst);
        }
        else
        {
            /* no upper bound - start with the fixed lower bound */
            int i;
            for (i = 0 ; i < lo ; ++i)
                firstChild->generate(vmg_ dst);

            /* 
             *   Now add additional items one at a time, with 67% probability
             *   for each added item.  Stop when we fail the roll.  
             */
            for (i = 0 ;
                 rand_range(rng_next(vmg0_), 0, 99) < 67 && i < MAX_UNBOUNDED ;
                 ++i)
                firstChild->generate(vmg_ dst);
        }
    }